

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

void google::protobuf::io::Tokenizer::ParseStringAppend(string *text,string *output)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  pointer pcVar4;
  bool bVar5;
  ulong uVar6;
  LogMessage *pLVar7;
  uint len;
  uint uVar8;
  uint32 x;
  pointer pcVar9;
  pointer pcVar10;
  ulong uVar11;
  long lVar12;
  uint32 unicode;
  LogFinisher local_89;
  string local_88;
  LogMessage local_68;
  
  if (text->_M_string_length == 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x414);
    pLVar7 = internal::LogMessage::operator<<
                       (&local_68,
                        " Tokenizer::ParseStringAppend() passed text that could not have been tokenized as a string: "
                       );
    CEscape(&local_88,text);
    pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_88);
    internal::LogFinisher::operator=(&local_89,pLVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_88._M_dataplus._M_p._4_4_,(uint)local_88._M_dataplus._M_p) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_88._M_dataplus._M_p._4_4_,(uint)local_88._M_dataplus._M_p),
                      local_88.field_2._M_allocated_capacity + 1);
    }
    internal::LogMessage::~LogMessage(&local_68);
    return;
  }
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(output->_M_dataplus)._M_p != &output->field_2) {
    uVar6 = (output->field_2)._M_allocated_capacity;
  }
  if (uVar6 < text->_M_string_length + output->_M_string_length) {
    std::__cxx11::string::reserve((ulong)output);
  }
  pcVar9 = (text->_M_dataplus)._M_p;
LAB_005b547c:
  cVar2 = pcVar9[1];
  if (cVar2 == '\\') {
    bVar3 = pcVar9[2];
    if (bVar3 == 0) goto LAB_005b5508;
    pcVar10 = pcVar9 + 2;
    if ((bVar3 & 0xf8) == 0x30) {
      pcVar4 = pcVar10;
      if ((pcVar9[3] & 0xf8U) == 0x30) {
        pcVar4 = pcVar9 + 3;
      }
      pcVar10 = pcVar4 + 1;
      if ((pcVar4[1] & 0xf8U) != 0x30) {
        pcVar10 = pcVar4;
      }
    }
    else if (bVar3 < 0x62) {
      if (bVar3 < 0x55) {
        if (((bVar3 != 0x22) && (bVar3 != 0x27)) && (bVar3 != 0x3f)) goto switchD_005b555f_caseD_6f;
      }
      else {
        if (bVar3 == 0x55) goto switchD_005b555f_caseD_75;
        if ((bVar3 != 0x5c) && (bVar3 != 0x61)) goto switchD_005b555f_caseD_6f;
      }
    }
    else {
      switch(bVar3) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
switchD_005b555f_caseD_6f:
        break;
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
switchD_005b555f_caseD_75:
        len = (uint)(bVar3 == 0x55) << 3;
        if (bVar3 == 0x75) {
          len = 4;
        }
        bVar5 = ReadHexDigits(pcVar9 + 3,len,(uint32 *)&local_88);
        uVar8 = (uint)local_88._M_dataplus._M_p;
        if (bVar5) {
          uVar6 = (ulong)len;
          uVar11 = uVar6 | 3;
          if (((uint)local_88._M_dataplus._M_p & 0xfffffc00) == 0xd800) {
            if ((((pcVar9[uVar6 + 3] == '\\') && (pcVar9[uVar6 + 4] == 'u')) &&
                (bVar5 = ReadHexDigits(pcVar9 + uVar6 + 5,4,&local_68.level_), bVar5)) &&
               ((local_68.level_ & 0xfffffc00) == 0xdc00)) {
              uVar8 = uVar8 * 0x400 + local_68.level_ + 0xfca02400;
              uVar11 = uVar6 + 9;
              local_88._M_dataplus._M_p._0_4_ = uVar8;
            }
            pcVar9 = pcVar9 + uVar11;
LAB_005b570f:
            if (uVar8 < 0x10000) {
              lVar12 = 3;
              x = (uVar8 & 0xf000) * 0x10 + (uVar8 & 0x3f) + (uVar8 & 0xfc0) * 4 + 0xe08080;
              goto LAB_005b57b1;
            }
            if (uVar8 < 0x200000) {
              lVar12 = 4;
              x = (uVar8 & 0x3f | (uVar8 & 0x3f000) << 4 | (uVar8 & 0x1c0000) << 6) + 0xf0808080 +
                  (uVar8 & 0xfc0) * 4;
              goto LAB_005b57b1;
            }
            StringAppendF(output,"\\U%08x",(ulong)uVar8);
          }
          else {
            pcVar9 = pcVar9 + uVar11;
            lVar12 = 1;
            x = (uint)local_88._M_dataplus._M_p;
            if (0x7f < (uint)local_88._M_dataplus._M_p) {
              if (0x7ff < (uint)local_88._M_dataplus._M_p) goto LAB_005b570f;
              x = ((uint)local_88._M_dataplus._M_p & 0x3f) + 0xc080 +
                  ((uint)local_88._M_dataplus._M_p & 0x7c0) * 4;
              lVar12 = 2;
            }
LAB_005b57b1:
            local_68.level_ = ghtonl(x);
            std::__cxx11::string::append((char *)output,(long)&local_68 + (4 - lVar12));
          }
          pcVar9 = pcVar9 + -1;
        }
        else {
          std::__cxx11::string::push_back((char)output);
          pcVar9 = pcVar10;
        }
        goto LAB_005b547c;
      case 0x76:
        break;
      case 0x78:
        cVar2 = pcVar9[3];
        if ((byte)(cVar2 + 0x9fU) < 6 || (byte)(cVar2 - 0x30U) < 10) {
          pcVar10 = pcVar9 + 3;
          if (9 < (byte)(cVar2 - 0x30U)) {
LAB_005b55d2:
            pcVar10 = pcVar9 + 3;
          }
        }
        else if ((byte)(cVar2 + 0xbfU) < 6) goto LAB_005b55d2;
        cVar2 = pcVar10[1];
        if (((byte)(cVar2 + 0x9fU) < 6 || (byte)(cVar2 - 0x30U) < 10) || ((byte)(cVar2 + 0xbfU) < 6)
           ) {
          pcVar10 = pcVar10 + 1;
        }
        break;
      default:
        if ((bVar3 != 0x62) && (bVar3 != 0x66)) goto switchD_005b555f_caseD_6f;
      }
    }
  }
  else {
    if (cVar2 == '\0') {
      return;
    }
LAB_005b5508:
    pcVar10 = pcVar9 + 1;
    if ((cVar2 == *(text->_M_dataplus)._M_p) &&
       (pcVar1 = pcVar9 + 2, pcVar9 = pcVar10, *pcVar1 == '\0')) goto LAB_005b547c;
  }
  std::__cxx11::string::push_back((char)output);
  pcVar9 = pcVar10;
  goto LAB_005b547c;
}

Assistant:

void Tokenizer::ParseStringAppend(const string& text, string* output) {
  // Reminder: text[0] is always a quote character.  (If text is
  // empty, it's invalid, so we'll just return).
  const size_t text_size = text.size();
  if (text_size == 0) {
    GOOGLE_LOG(DFATAL)
      << " Tokenizer::ParseStringAppend() passed text that could not"
         " have been tokenized as a string: " << CEscape(text);
    return;
  }

  // Reserve room for new string. The branch is necessary because if
  // there is already space available the reserve() call might
  // downsize the output.
  const size_t new_len = text_size + output->size();
  if (new_len > output->capacity()) {
    output->reserve(new_len);
  }

  // Loop through the string copying characters to "output" and
  // interpreting escape sequences.  Note that any invalid escape
  // sequences or other errors were already reported while tokenizing.
  // In this case we do not need to produce valid results.
  for (const char* ptr = text.c_str() + 1; *ptr != '\0'; ptr++) {
    if (*ptr == '\\' && ptr[1] != '\0') {
      // An escape sequence.
      ++ptr;

      if (OctalDigit::InClass(*ptr)) {
        // An octal escape.  May one, two, or three digits.
        int code = DigitValue(*ptr);
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'x') {
        // A hex escape.  May zero, one, or two digits.  (The zero case
        // will have been caught as an error earlier.)
        int code = 0;
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = DigitValue(*ptr);
        }
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 16 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'u' || *ptr == 'U') {
        uint32 unicode;
        const char* end = FetchUnicodePoint(ptr, &unicode);
        if (end == ptr) {
          // Failure: Just dump out what we saw, don't try to parse it.
          output->push_back(*ptr);
        } else {
          AppendUTF8(unicode, output);
          ptr = end - 1;  // Because we're about to ++ptr.
        }
      } else {
        // Some other escape code.
        output->push_back(TranslateEscape(*ptr));
      }

    } else if (*ptr == text[0] && ptr[1] == '\0') {
      // Ignore final quote matching the starting quote.
    } else {
      output->push_back(*ptr);
    }
  }
}